

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

void Saig_ParBmcSetDefaultParams(Saig_ParBmc_t *p)

{
  p->nLearnedStart = 0;
  p->nLearnedDelta = 0;
  p->nLearnedPerce = 0;
  p->fVerbose = 0;
  *(undefined8 *)&p->fNotVerbose = 0;
  p->pLogFileName = (char *)0x0;
  p->fSilent = 0;
  p->iFrame = 0;
  p->nFailOuts = 0;
  p->nDropOuts = 0;
  p->timeLastSolved = 0;
  p->pFuncOnFail = (_func_int_int_Abc_Cex_t_ptr *)0x0;
  p->fDropSatOuts = 0;
  p->nFfToAddMax = 0;
  p->fSkipRand = 0;
  p->fNoRestarts = 0;
  p->nPisAbstract = 0;
  p->fSolveAll = 0;
  p->fStoreCex = 0;
  p->fUseBridge = 0;
  p->nFramesJump = 0;
  p->nTimeOut = 0;
  p->nTimeOutGap = 0;
  p->nTimeOutOne = 0;
  p->nStart = 0;
  p->nFramesMax = 0;
  p->nConfLimit = 0;
  p->nConfLimitJump = 0;
  p->nLearnedStart = 10000;
  p->nLearnedDelta = 2000;
  p->nLearnedPerce = 0x50;
  p->fNotVerbose = 0;
  p->iFrame = -1;
  p->nFailOuts = 0;
  p->nDropOuts = 0;
  p->timeLastSolved = 0;
  return;
}

Assistant:

void Saig_ParBmcSetDefaultParams( Saig_ParBmc_t * p )
{
    memset( p, 0, sizeof(Saig_ParBmc_t) );
    p->nStart         =     0;    // maximum number of timeframes 
    p->nFramesMax     =     0;    // maximum number of timeframes 
    p->nConfLimit     =     0;    // maximum number of conflicts at a node
    p->nConfLimitJump =     0;    // maximum number of conflicts after jumping
    p->nFramesJump    =     0;    // the number of tiemframes to jump
    p->nTimeOut       =     0;    // approximate timeout in seconds
    p->nTimeOutGap    =     0;    // time since the last CEX found
    p->nPisAbstract   =     0;    // the number of PIs to abstract
    p->fSolveAll      =     0;    // stops on the first SAT instance
    p->fDropSatOuts   =     0;    // replace sat outputs by constant 0
    p->nLearnedStart  = 10000;    // starting learned clause limit
    p->nLearnedDelta  =  2000;    // delta of learned clause limit
    p->nLearnedPerce  =    80;    // ratio of learned clause limit
    p->fVerbose       =     0;    // verbose 
    p->fNotVerbose    =     0;    // skip line-by-line print-out 
    p->iFrame         =    -1;    // explored up to this frame
    p->nFailOuts      =     0;    // the number of failed outputs
    p->nDropOuts      =     0;    // the number of timed out outputs
    p->timeLastSolved =     0;    // time when the last one was solved
}